

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

plain_range_sorted<CSkins::CSkin>
partition_binary<plain_range_sorted<CSkins::CSkin>,CSkins::CSkin>
          (plain_range_sorted<CSkins::CSkin> range,CSkin value)

{
  plain_range<CSkins::CSkin> pVar1;
  bool bVar2;
  uint uVar3;
  int __c;
  CSkin *in_RSI;
  CSkin *in_RDI;
  long in_FS_OFFSET;
  plain_range_sorted<CSkins::CSkin> pVar4;
  uint pivot;
  CSkin *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  plain_range_sorted<CSkins::CSkin> *in_stack_ffffffffffffff98;
  CSkin *local_48;
  CSkin *local_40;
  CSkin *local_38;
  CSkin *local_30;
  plain_range<CSkins::CSkin> local_28;
  CSkin *local_18;
  CSkin *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.begin = in_RDI;
  local_28.end = in_RSI;
  concept_empty::check<plain_range_sorted<CSkins::CSkin>>
            ((plain_range_sorted<CSkins::CSkin> *)&local_28);
  concept_index::check<plain_range_sorted<CSkins::CSkin>>
            ((plain_range_sorted<CSkins::CSkin> *)&local_28);
  concept_size::check<plain_range_sorted<CSkins::CSkin>>
            ((plain_range_sorted<CSkins::CSkin> *)&local_28);
  concept_slice::check<plain_range_sorted<CSkins::CSkin>>
            ((plain_range_sorted<CSkins::CSkin> *)&local_28);
  concept_sorted::check<plain_range_sorted<CSkins::CSkin>>
            ((plain_range_sorted<CSkins::CSkin> *)&local_28);
  bVar2 = plain_range<CSkins::CSkin>::empty(&local_28);
  if (bVar2) {
    local_18 = local_28.begin;
    local_10 = local_28.end;
  }
  else {
    plain_range<CSkins::CSkin>::back
              ((plain_range<CSkins::CSkin> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    bVar2 = CSkins::CSkin::operator<
                      ((CSkin *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
    if (bVar2) {
      plain_range_sorted<CSkins::CSkin>::plain_range_sorted
                ((plain_range_sorted<CSkins::CSkin> *)0x1c194f);
    }
    else {
      while (uVar3 = plain_range<CSkins::CSkin>::size(&local_28), 1 < uVar3) {
        uVar3 = plain_range<CSkins::CSkin>::size(&local_28);
        plain_range<CSkins::CSkin>::index(&local_28,(char *)(ulong)(uVar3 - 1 >> 1),__c);
        bVar2 = CSkins::CSkin::operator<
                          ((CSkin *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
        if (bVar2) {
          plain_range<CSkins::CSkin>::size(&local_28);
          pVar4 = plain_range_sorted<CSkins::CSkin>::slice
                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff90);
          local_38 = pVar4.super_plain_range<CSkins::CSkin>.begin;
          local_28.begin = local_38;
          local_30 = pVar4.super_plain_range<CSkins::CSkin>.end;
          local_28.end = local_30;
        }
        else {
          pVar4 = plain_range_sorted<CSkins::CSkin>::slice
                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff90);
          local_48 = pVar4.super_plain_range<CSkins::CSkin>.begin;
          local_28.begin = local_48;
          local_40 = pVar4.super_plain_range<CSkins::CSkin>.end;
          local_28.end = local_40;
        }
      }
      local_18 = local_28.begin;
      local_10 = local_28.end;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  pVar1.end = local_10;
  pVar1.begin = local_18;
  return (plain_range_sorted<CSkins::CSkin>)pVar1;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}